

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TFad<6,_double>,_3>::TPZManVector
          (TPZManVector<TFad<6,_double>,_3> *this,int64_t size,TFad<6,_double> *copy)

{
  undefined8 *puVar1;
  long lVar2;
  int64_t *piVar3;
  TFad<6,_double> *pTVar4;
  int64_t iVar5;
  TFad<6,_double> *pTVar6;
  TFad<6,_double> *pTVar7;
  long lVar8;
  
  (this->super_TPZVec<TFad<6,_double>_>).fStore = (TFad<6,_double> *)0x0;
  (this->super_TPZVec<TFad<6,_double>_>).fNElements = 0;
  (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
  (this->super_TPZVec<TFad<6,_double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189f520;
  lVar2 = 0x28;
  do {
    *(undefined ***)((long)this->fExtAlloc[0].dx_ + lVar2 + -0x38) = &PTR__TFad_0185d2b8;
    puVar1 = (undefined8 *)((long)this->fExtAlloc[0].dx_ + lVar2 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->fExtAlloc[0].dx_ + lVar2 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->fExtAlloc[0].dx_ + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this->fExtAlloc[0].dx_ + lVar2) = 0;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0xe8);
  if (size < 4) {
    pTVar4 = this->fExtAlloc;
    iVar5 = 0;
  }
  else {
    piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)size >> 0x3a != 0) | size * 0x40 | 8);
    *piVar3 = size;
    pTVar4 = (TFad<6,_double> *)(piVar3 + 1);
    pTVar6 = pTVar4;
    do {
      (pTVar6->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
      pTVar6->val_ = 0.0;
      pTVar6->dx_[0] = 0.0;
      pTVar6->dx_[1] = 0.0;
      pTVar6->dx_[2] = 0.0;
      pTVar6->dx_[3] = 0.0;
      pTVar6->dx_[4] = 0.0;
      pTVar6->dx_[5] = 0.0;
      pTVar6 = pTVar6 + 1;
      iVar5 = size;
    } while (pTVar6 != (TFad<6,_double> *)(piVar3 + size * 8 + 1));
  }
  (this->super_TPZVec<TFad<6,_double>_>).fStore = pTVar4;
  (this->super_TPZVec<TFad<6,_double>_>).fNElements = size;
  (this->super_TPZVec<TFad<6,_double>_>).fNAlloc = iVar5;
  if (0 < size) {
    pTVar4 = (this->super_TPZVec<TFad<6,_double>_>).fStore;
    lVar2 = 0;
    pTVar6 = pTVar4;
    do {
      pTVar7 = pTVar4 + lVar2;
      if (pTVar7 != copy) {
        lVar8 = 2;
        do {
          pTVar6->dx_[lVar8 + -2] = copy->dx_[lVar8 + -2];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pTVar7->val_ = copy->val_;
      }
      lVar2 = lVar2 + 1;
      pTVar6 = pTVar6 + 1;
    } while (lVar2 != size);
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}